

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

int Cloud_SharingSize(CloudManager *dd,CloudNode **pn,int nn)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  CloudNode *n;
  ulong uVar4;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)nn;
  if (nn < 1) {
    uVar2 = uVar4;
  }
  iVar3 = 0;
  n = (CloudNode *)pn;
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = cloudDagSize((CloudManager *)((ulong)pn[uVar4] & 0xfffffffffffffffe),n);
    iVar3 = iVar3 + iVar1;
  }
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    cloudClearMark((CloudManager *)((ulong)pn[uVar4] & 0xfffffffffffffffe),n);
  }
  return iVar3;
}

Assistant:

int Cloud_SharingSize( CloudManager * dd, CloudNode ** pn, int nn )
{
    int res, i;
    res = 0;
    for ( i = 0; i < nn; i++ )
        res += cloudDagSize( dd, Cloud_Regular( pn[i] ) );
    for ( i = 0; i < nn; i++ )
        cloudClearMark( dd, Cloud_Regular( pn[i] ) );
    return res;
}